

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnDataDropExpr
          (ExprVisitorDelegate *this,DataDropExpr *expr)

{
  WatWriter *this_00;
  Info local_58;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_58,(Opcode *)&Opcode::DataDrop_Opcode);
  WritePuts(this_00,local_58.name,Space);
  WriteVar(this->writer_,&expr->var,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnDataDropExpr(DataDropExpr* expr) {
  writer_->WritePutsSpace(Opcode::DataDrop_Opcode.GetName());
  writer_->WriteVar(expr->var, NextChar::Newline);
  return Result::Ok;
}